

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTable.c
# Opt level: O3

void Hop_TableInsert(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  uint uVar1;
  Hop_Obj_t *pHVar2;
  uint uVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t **ppHVar5;
  Hop_Obj_t **ppHVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  timespec ts;
  timespec local_40;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                  ,0x67,"void Hop_TableInsert(Hop_Man_t *, Hop_Obj_t *)");
  }
  pHVar4 = Hop_TableLookup(p,pObj);
  if (pHVar4 != (Hop_Obj_t *)0x0) {
    __assert_fail("Hop_TableLookup(p, pObj) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                  ,0x68,"void Hop_TableInsert(Hop_Man_t *, Hop_Obj_t *)");
  }
  if (((char)pObj->Id == '\0') && (p->nTableSize * 2 < p->nObjs[5] + p->nObjs[4])) {
    clock_gettime(3,&local_40);
    ppHVar6 = p->pTable;
    uVar1 = p->nTableSize;
    iVar10 = p->nObjs[5] + p->nObjs[4];
    uVar7 = iVar10 * 2 - 1;
    while( true ) {
      do {
        uVar8 = uVar7 + 1;
        uVar3 = uVar7 & 1;
        uVar7 = uVar8;
      } while (uVar3 != 0);
      if (uVar8 < 9) break;
      iVar9 = 5;
      while (uVar8 % (iVar9 - 2U) != 0) {
        uVar3 = iVar9 * iVar9;
        iVar9 = iVar9 + 2;
        if (uVar8 < uVar3) goto LAB_00800263;
      }
    }
LAB_00800263:
    p->nTableSize = uVar8;
    ppHVar5 = (Hop_Obj_t **)calloc(1,(long)(int)uVar8 << 3);
    p->pTable = ppHVar5;
    if ((int)uVar1 < 1) {
      iVar9 = 0;
    }
    else {
      uVar11 = 0;
      iVar9 = 0;
      do {
        pHVar4 = ppHVar6[uVar11];
        while (pHVar4 != (Hop_Obj_t *)0x0) {
          pHVar2 = (pHVar4->field_1).pNext;
          ppHVar5 = Hop_TableFind(p,pHVar4);
          if (*ppHVar5 != (Hop_Obj_t *)0x0) {
            __assert_fail("*ppPlace == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                          ,0xbb,"void Hop_TableResize(Hop_Man_t *)");
          }
          *ppHVar5 = pHVar4;
          (pHVar4->field_1).pNext = (Hop_Obj_t *)0x0;
          iVar9 = iVar9 + 1;
          pHVar4 = pHVar2;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar1);
      iVar10 = p->nObjs[5] + p->nObjs[4];
    }
    if (iVar9 != iVar10) {
      __assert_fail("Counter == nEntries",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                    ,0xc2,"void Hop_TableResize(Hop_Man_t *)");
    }
    if (ppHVar6 != (Hop_Obj_t **)0x0) {
      free(ppHVar6);
    }
  }
  ppHVar6 = Hop_TableFind(p,pObj);
  if (*ppHVar6 != (Hop_Obj_t *)0x0) {
    __assert_fail("*ppPlace == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopTable.c"
                  ,0x6c,"void Hop_TableInsert(Hop_Man_t *, Hop_Obj_t *)");
  }
  *ppHVar6 = pObj;
  return;
}

Assistant:

void Hop_TableInsert( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    Hop_Obj_t ** ppPlace;
    assert( !Hop_IsComplement(pObj) );
    assert( Hop_TableLookup(p, pObj) == NULL );
    if ( (pObj->Id & 0xFF) == 0 && 2 * p->nTableSize < Hop_ManNodeNum(p) )
        Hop_TableResize( p );
    ppPlace = Hop_TableFind( p, pObj );
    assert( *ppPlace == NULL );
    *ppPlace = pObj;
}